

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_PrintMulti(Dtt_Man_t *p)

{
  int iVar1;
  uint local_334;
  int Log;
  int Count;
  int Total;
  int i;
  int Counts [13] [15];
  uint local_14;
  int n;
  Dtt_Man_t *p_local;
  
  memset(&Total,0,0x30c);
  local_14 = 0;
  while( true ) {
    if (0xc < (int)local_14) {
      return;
    }
    Log = 0;
    local_334 = 0;
    for (Count = 0; Count < p->nClasses; Count = Count + 1) {
      if (p->pNodes[Count] == local_14) {
        iVar1 = Abc_Base2Log(p->pTimes[Count]);
        if (0xe < iVar1) {
          __assert_fail("Log < 15",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn2.c"
                        ,0x298,"void Dtt_PrintMulti(Dtt_Man_t *)");
        }
        if (p->pTimes[Count] < 2) {
          (&Total)[(long)(int)local_14 * 0xf] = (&Total)[(long)(int)local_14 * 0xf] + 1;
        }
        else {
          (&Total)[(long)(int)local_14 * 0xf + (long)iVar1] =
               (&Total)[(long)(int)local_14 * 0xf + (long)iVar1] + 1;
        }
        Log = p->pTimes[Count] + Log;
        local_334 = local_334 + 1;
      }
    }
    if (local_334 == 0) break;
    printf("n=%2d : ",(ulong)local_14);
    printf("All = %7d  ",(ulong)local_334);
    printf("Ave = %6.2f  ",((double)Log * 1.0) / (double)(int)local_334);
    for (Count = 0; Count < 0xf; Count = Count + 1) {
      if ((&Total)[(long)(int)local_14 * 0xf + (long)Count] == 0) {
        printf("%6s","");
      }
      else {
        printf("%6d",(ulong)(uint)(&Total)[(long)(int)local_14 * 0xf + (long)Count]);
      }
    }
    printf("\n");
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Dtt_PrintMulti( Dtt_Man_t * p )
{
    int n, Counts[13][15] = {{0}};
    for ( n = 0; n < 13; n++ )
    {
        int i, Total = 0, Count = 0;
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
            {
                int Log = Abc_Base2Log(p->pTimes[i]);
                assert( Log < 15 );
                if ( p->pTimes[i] < 2 )
                    Counts[n][0]++;
                else
                    Counts[n][Log]++;
                Total += p->pTimes[i];
                Count++;
            }
        if ( Count == 0 )
            break;
        printf( "n=%2d : ", n );
        printf( "All = %7d  ", Count );
        printf( "Ave = %6.2f  ", 1.0*Total/Count );
        for ( i = 0; i < 15; i++ )
            if ( Counts[n][i] )
                printf( "%6d", Counts[n][i] );
            else
                printf( "%6s", "" );
        printf( "\n" );
    }
}